

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O2

LY_ERR lyxml_value_compare(ly_ctx *ctx1,char *value1,void *val_prefix_data1,ly_ctx *ctx2,
                          char *value2,void *val_prefix_data2)

{
  char *__s2;
  bool bVar1;
  LY_ERR LVar2;
  int iVar3;
  lys_module *plVar4;
  lys_module *plVar5;
  bool bVar6;
  ly_bool is_prefix2;
  ly_bool is_prefix1;
  uint32_t value2_len;
  uint32_t value1_len;
  ly_ctx *local_50;
  void *local_48;
  char *value2_next;
  char *value1_next;
  
  LVar2 = LY_SUCCESS;
  if (value1 != (char *)0x0 || value2 != (char *)0x0) {
    if ((value1 != (char *)0x0) == (value2 != (char *)0x0)) {
      if (ctx2 == (ly_ctx *)0x0) {
        ctx2 = ctx1;
      }
      local_50 = ctx1;
      local_48 = val_prefix_data1;
LAB_00199642:
      do {
        while( true ) {
          bVar6 = value2 != (char *)0x0;
          bVar1 = value1 != (char *)0x0;
          LVar2 = LY_SUCCESS;
          if ((value1 == (char *)0x0) || (value2 == (char *)0x0)) goto LAB_0019978a;
          LVar2 = ly_value_prefix_next(value1,(char *)0x0,&value1_len,&is_prefix1,&value1_next);
          bVar1 = true;
          if ((LVar2 != LY_SUCCESS) ||
             (LVar2 = ly_value_prefix_next(value2,(char *)0x0,&value2_len,&is_prefix2,&value2_next),
             LVar2 != LY_SUCCESS)) {
            bVar6 = true;
            goto LAB_0019978a;
          }
          if (is_prefix1 != is_prefix2) goto LAB_0019977a;
          if (is_prefix1 != '\0') break;
          if (value1_len != value2_len) goto LAB_0019977a;
          iVar3 = strncmp(value1,value2,(ulong)value1_len);
LAB_0019974f:
          value2 = value2_next;
          value1 = value1_next;
          if (iVar3 != 0) goto LAB_0019977a;
        }
        if (local_48 == (void *)0x0) {
          plVar4 = (lys_module *)0x0;
        }
        else {
          plVar4 = ly_resolve_prefix(local_50,value1,(ulong)value1_len,LY_VALUE_XML,local_48);
        }
        if (((val_prefix_data2 == (void *)0x0) ||
            (plVar5 = ly_resolve_prefix(ctx2,value2,(ulong)value2_len,LY_VALUE_XML,val_prefix_data2)
            , plVar4 == (lys_module *)0x0)) || (plVar5 == (lys_module *)0x0)) break;
        if (plVar4->ctx == plVar5->ctx) {
          if ((plVar4->name != plVar5->name) ||
             (value2 = value2_next, value1 = value1_next, plVar4->revision != plVar5->revision))
          break;
          goto LAB_00199642;
        }
        iVar3 = strcmp(plVar4->name,plVar5->name);
        if (iVar3 != 0) break;
        __s2 = plVar5->revision;
        if (plVar4->revision != (char *)0x0) {
          if (__s2 != (char *)0x0) {
            iVar3 = strcmp(plVar4->revision,__s2);
            goto LAB_0019974f;
          }
          break;
        }
        value2 = value2_next;
        value1 = value1_next;
      } while (__s2 == (char *)0x0);
LAB_0019977a:
      bVar6 = true;
      LVar2 = LY_ENOT;
LAB_0019978a:
      if (bVar1 || bVar6) {
        LVar2 = LY_ENOT;
      }
    }
    else {
      LVar2 = LY_ENOT;
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
lyxml_value_compare(const struct ly_ctx *ctx1, const char *value1, void *val_prefix_data1,
        const struct ly_ctx *ctx2, const char *value2, void *val_prefix_data2)
{
    const char *value1_iter, *value2_iter;
    const char *value1_next, *value2_next;
    uint32_t value1_len, value2_len;
    ly_bool is_prefix1, is_prefix2;
    const struct lys_module *mod1, *mod2;
    LY_ERR ret;

    if (!value1 && !value2) {
        return LY_SUCCESS;
    }
    if ((value1 && !value2) || (!value1 && value2)) {
        return LY_ENOT;
    }

    if (!ctx2) {
        ctx2 = ctx1;
    }

    ret = LY_SUCCESS;
    for (value1_iter = value1, value2_iter = value2;
            value1_iter && value2_iter;
            value1_iter = value1_next, value2_iter = value2_next) {
        if ((ret = ly_value_prefix_next(value1_iter, NULL, &value1_len, &is_prefix1, &value1_next))) {
            break;
        }
        if ((ret = ly_value_prefix_next(value2_iter, NULL, &value2_len, &is_prefix2, &value2_next))) {
            break;
        }

        if (is_prefix1 != is_prefix2) {
            ret = LY_ENOT;
            break;
        }

        if (!is_prefix1) {
            if (value1_len != value2_len) {
                ret = LY_ENOT;
                break;
            }
            if (strncmp(value1_iter, value2_iter, value1_len)) {
                ret = LY_ENOT;
                break;
            }
            continue;
        }

        mod1 = mod2 = NULL;
        if (val_prefix_data1) {
            /* find module of the first prefix, if any */
            mod1 = ly_resolve_prefix(ctx1, value1_iter, value1_len, LY_VALUE_XML, val_prefix_data1);
        }
        if (val_prefix_data2) {
            mod2 = ly_resolve_prefix(ctx2, value2_iter, value2_len, LY_VALUE_XML, val_prefix_data2);
        }
        if (!mod1 || !mod2) {
            /* not a prefix or maps to different namespaces */
            ret = LY_ENOT;
            break;
        }

        if (mod1->ctx == mod2->ctx) {
            /* same contexts */
            if ((mod1->name != mod2->name) || (mod1->revision != mod2->revision)) {
                ret = LY_ENOT;
                break;
            }
        } else {
            /* different contexts */
            if (strcmp(mod1->name, mod2->name)) {
                ret = LY_ENOT;
                break;
            }

            if (mod1->revision || mod2->revision) {
                if (!mod1->revision || !mod2->revision) {
                    ret = LY_ENOT;
                    break;
                }
                if (strcmp(mod1->revision, mod2->revision)) {
                    ret = LY_ENOT;
                    break;
                }
            }
        }
    }

    if (value1_iter || value2_iter) {
        ret = LY_ENOT;
    }

    return ret;
}